

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# named_local_mbox.cpp
# Opt level: O0

void __thiscall
so_5::impl::named_local_mbox_t::named_local_mbox_t
          (named_local_mbox_t *this,string *name,mbox_t *mbox,mbox_core_t *mbox_core)

{
  mbox_core_t *mbox_core_local;
  mbox_t *mbox_local;
  string *name_local;
  named_local_mbox_t *this_local;
  
  abstract_message_box_t::abstract_message_box_t(&this->super_abstract_message_box_t);
  (this->super_abstract_message_box_t)._vptr_abstract_message_box_t =
       (_func_int **)&PTR__named_local_mbox_t_005c1a60;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  mbox_core_ref_t::mbox_core_ref_t(&this->m_mbox_core,mbox_core);
  intrusive_ptr_t<so_5::abstract_message_box_t>::intrusive_ptr_t(&this->m_mbox,mbox);
  return;
}

Assistant:

named_local_mbox_t::named_local_mbox_t(
	const std::string & name,
	const mbox_t & mbox,
	impl::mbox_core_t & mbox_core )
	:
		m_name( name ),
		m_mbox_core( &mbox_core ),
		m_mbox( mbox )
{
}